

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<short> * __thiscall
cimg_library::CImg<short>::assign(CImg<short> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CImgArgumentException *this_00;
  char *pcVar5;
  char *pcVar6;
  short *psVar7;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  CImg<short> *in_RDI;
  uint in_R8D;
  uint curr_siz;
  uint siz;
  CImg<short> *in_stack_fffffffffffffee0;
  CImg<short> *local_30;
  
  uVar3 = in_ESI * in_EDX * in_ECX * in_R8D;
  if (uVar3 == 0) {
    local_30 = assign(in_stack_fffffffffffffee0);
  }
  else {
    uVar4 = size(in_RDI);
    if (uVar3 != uVar4) {
      if ((in_RDI->_is_shared & 1U) != 0) {
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
        uVar3 = in_RDI->_width;
        uVar4 = in_RDI->_height;
        uVar1 = in_RDI->_depth;
        uVar2 = in_RDI->_spectrum;
        psVar7 = in_RDI->_data;
        pcVar5 = "non-";
        if ((in_RDI->_is_shared & 1U) != 0) {
          pcVar5 = "";
        }
        pcVar6 = pixel_type();
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign() : Invalid assignement request of shared instance from specified image (%u,%u,%u,%u)."
                   ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,psVar7,pcVar5,pcVar6,in_ESI,
                   in_EDX,in_ECX,in_R8D);
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                    CImgArgumentException::~CImgArgumentException);
      }
      if (in_RDI->_data != (short *)0x0) {
        operator_delete__(in_RDI->_data);
      }
      psVar7 = (short *)operator_new__((ulong)uVar3 * 2);
      in_RDI->_data = psVar7;
    }
    in_RDI->_width = in_ESI;
    in_RDI->_height = in_EDX;
    in_RDI->_depth = in_ECX;
    in_RDI->_spectrum = in_R8D;
    local_30 = in_RDI;
  }
  return local_30;
}

Assistant:

CImg<T>& assign(const unsigned int size_x, const unsigned int size_y=1, const unsigned int size_z=1, const unsigned int size_c=1) {
      const unsigned int siz = size_x*size_y*size_z*size_c;
      if (!siz) return assign();
      const unsigned int curr_siz = size();
      if (siz!=curr_siz) {
        if (_is_shared)
          throw CImgArgumentException(_cimg_instance
                                      "assign() : Invalid assignement request of shared instance from specified image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      size_x,size_y,size_z,size_c);
        else {
          delete[] _data;
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "assign() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(size_x*size_y*size_z*size_c*sizeof(T)),size_x,size_y,size_z,size_c);
          }
        }
      }
      _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      return *this;
    }